

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void floor_carry_fail(chunk *c,object *drop,_Bool broke)

{
  _Bool _Var1;
  char *local_88;
  char *verb;
  char o_name [80];
  object *known;
  object *poStack_18;
  _Bool broke_local;
  object *drop_local;
  chunk *c_local;
  
  o_name._72_8_ = drop->known;
  poStack_18 = drop;
  drop_local = (object *)c;
  if ((object *)o_name._72_8_ != (object *)0x0) {
    if (broke) {
      local_88 = "break";
      if (drop->number == '\x01') {
        local_88 = "breaks";
      }
    }
    else {
      local_88 = "disappear";
      if (drop->number == '\x01') {
        local_88 = "disappears";
      }
    }
    object_desc((char *)&verb,0x50,drop,0,player);
    msg("The %s %s.",&verb,local_88);
    _Var1 = loc_is_zero(*(loc *)(o_name._72_8_ + 0x34));
    if (!_Var1) {
      square_excise_object
                ((chunk *)player->cave,*(loc_conflict *)(o_name._72_8_ + 0x34),
                 (object *)o_name._72_8_);
    }
    delist_object((chunk_conflict *)player->cave,(object *)o_name._72_8_);
    object_delete((chunk *)player->cave,(chunk *)0x0,(object **)(o_name + 0x48));
  }
  delist_object((chunk_conflict *)drop_local,poStack_18);
  object_delete((chunk *)drop_local,(chunk *)player->cave,&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void floor_carry_fail(struct chunk *c, struct object *drop, bool broke)
{
	struct object *known = drop->known;

	/* Delete completely */
	if (known) {
		char o_name[80];
		const char *verb = broke ?
			VERB_AGREEMENT(drop->number, "breaks", "break") :
			VERB_AGREEMENT(drop->number, "disappears", "disappear");
		object_desc(o_name, sizeof(o_name), drop, ODESC_BASE, player);
		msg("The %s %s.", o_name, verb);
		if (!loc_is_zero(known->grid))
			square_excise_object(player->cave, known->grid, known);
		delist_object(player->cave, known);
		object_delete(player->cave, NULL, &known);
	}
	delist_object(c, drop);
	object_delete(c, player->cave, &drop);
}